

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O0

void __thiscall libtorrent::aux::socks5::handshake2(socks5 *this,error_code *e)

{
  wait_op *pwVar1;
  bool bVar2;
  byte bVar3;
  uint8_t uVar4;
  uchar uVar5;
  ulong uVar6;
  pointer data;
  pointer pvVar7;
  unsigned_long size_in_bytes;
  undefined1 local_d8 [8];
  error_code ec_2;
  operation_t local_bd [13];
  undefined1 local_b0 [64];
  mutable_buffer local_70;
  undefined1 local_60 [8];
  error_code ec_1;
  undefined1 local_48 [8];
  error_code ec;
  int method;
  int version;
  char *p;
  per_timer_data *local_18;
  error_code *e_local;
  socks5 *this_local;
  
  if ((this->m_abort & 1U) == 0) {
    local_18 = (per_timer_data *)e;
    e_local = (error_code *)this;
    bVar2 = boost::system::error_code::operator_cast_to_bool(e);
    if (bVar2) {
      bVar2 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts);
      if (bVar2) {
        p._7_1_ = 0x28;
        alert_manager::
        emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code_const&>
                  (this->m_alerts,&this->m_proxy_addr,(operation_t *)((long)&p + 7),
                   (error_code *)local_18);
      }
      this->m_failures = this->m_failures + 1;
      retry_connection(this);
    }
    else {
      _method = (wait_op *)::std::array<char,_270UL>::data(&this->m_tmp_buf);
      bVar3 = read_uint8<char*>((char **)&method);
      uVar4 = read_uint8<char*>((char **)&method);
      if (bVar3 < 5) {
        bVar2 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts);
        if (bVar2) {
          ec.cat_._7_1_ = 0x28;
          ec.cat_._0_4_ = 1;
          alert_manager::
          emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,libtorrent::socks_error::socks_error_code>
                    (this->m_alerts,&this->m_proxy_addr,(operation_t *)((long)&ec.cat_ + 7),
                     (socks_error_code *)&ec.cat_);
        }
        boost::system::error_code::error_code((error_code *)local_48);
        boost::asio::
        basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        ::close((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 *)&this->m_socks5_sock,(int)local_48);
      }
      else if (uVar4 == '\0') {
        socks_forward_udp(this);
      }
      else if (uVar4 == '\x02') {
        uVar6 = ::std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          _method = (wait_op *)::std::array<char,_270UL>::data(&this->m_tmp_buf);
          write_uint8<int,char*>(1,(char **)&method);
          uVar5 = ::std::__cxx11::string::size();
          write_uint8<unsigned_char,char*>(uVar5,(char **)&method);
          write_string(&(this->m_proxy_settings).username,(char **)&method);
          uVar5 = ::std::__cxx11::string::size();
          write_uint8<unsigned_char,char*>(uVar5,(char **)&method);
          write_string(&(this->m_proxy_settings).password,(char **)&method);
          data = ::std::array<char,_270UL>::data(&this->m_tmp_buf);
          pwVar1 = _method;
          pvVar7 = ::std::array<char,_270UL>::data(&this->m_tmp_buf);
          size_in_bytes = numeric_cast<unsigned_long,long,void>((long)pwVar1 - (long)pvVar7);
          local_70 = boost::asio::buffer(data,size_in_bytes);
          local_b0._16_8_ = handshake3;
          local_b0._24_4_ = 0;
          local_b0[0x1c] = '\0';
          local_b0._29_3_ = 0;
          self((socks5 *)local_b0);
          ::std::
          bind<void(libtorrent::aux::socks5::*)(boost::system::error_code_const&),std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>const&>
                    ((type *)(local_b0 + 0x20),(offset_in_socks5_to_subr *)(local_b0 + 0x10),
                     (shared_ptr<libtorrent::aux::socks5> *)local_b0,
                     (_Placeholder<1> *)&::std::placeholders::_1);
          boost::asio::
          async_write<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::asio::mutable_buffer,std::_Bind<void(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                    (&this->m_socks5_sock,&local_70,
                     (_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                      *)(local_b0 + 0x20),(type *)0x0);
          ::std::
          _Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          ::~_Bind((_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                    *)(local_b0 + 0x20));
          ::std::shared_ptr<libtorrent::aux::socks5>::~shared_ptr
                    ((shared_ptr<libtorrent::aux::socks5> *)local_b0);
        }
        else {
          bVar2 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts);
          if (bVar2) {
            ec_1.cat_._7_1_ = 0x28;
            ec_1.cat_._0_4_ = 5;
            alert_manager::
            emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,libtorrent::socks_error::socks_error_code>
                      (this->m_alerts,&this->m_proxy_addr,(operation_t *)((long)&ec_1.cat_ + 7),
                       (socks_error_code *)&ec_1.cat_);
          }
          boost::system::error_code::error_code((error_code *)local_60);
          boost::asio::
          basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ::close((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   *)&this->m_socks5_sock,(int)local_60);
        }
      }
      else {
        bVar2 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts);
        if (bVar2) {
          local_bd[0] = handshake;
          ec_2.cat_._4_4_ = 2;
          alert_manager::
          emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,libtorrent::socks_error::socks_error_code>
                    (this->m_alerts,&this->m_proxy_addr,local_bd,
                     (socks_error_code *)((long)&ec_2.cat_ + 4));
        }
        boost::system::error_code::error_code((error_code *)local_d8);
        boost::asio::
        basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        ::close((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 *)&this->m_socks5_sock,(int)local_d8);
      }
    }
  }
  return;
}

Assistant:

void socks5::handshake2(error_code const& e)
{
	COMPLETE_ASYNC("socks5::on_handshake2");
	if (m_abort) return;

	if (e)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::handshake, e);
		++m_failures;
		retry_connection();
		return;
	}

	using namespace libtorrent::aux;

	char* p = m_tmp_buf.data();
	int const version = read_uint8(p);
	int const method = read_uint8(p);

	if (version < 5)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::handshake
				, socks_error::unsupported_version);
		error_code ec;
		m_socks5_sock.close(ec);
		return;
	}

	if (method == 0)
	{
		socks_forward_udp(/*l*/);
	}
	else if (method == 2)
	{
		if (m_proxy_settings.username.empty())
		{
			if (m_alerts.should_post<socks5_alert>())
				m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::handshake
					, socks_error::username_required);
			error_code ec;
			m_socks5_sock.close(ec);
			return;
		}

		// start sub-negotiation
		p = m_tmp_buf.data();
		write_uint8(1, p);
		TORRENT_ASSERT(m_proxy_settings.username.size() < 0x100);
		write_uint8(uint8_t(m_proxy_settings.username.size()), p);
		write_string(m_proxy_settings.username, p);
		TORRENT_ASSERT(m_proxy_settings.password.size() < 0x100);
		write_uint8(uint8_t(m_proxy_settings.password.size()), p);
		write_string(m_proxy_settings.password, p);
		TORRENT_ASSERT_VAL(p - m_tmp_buf.data() < int(m_tmp_buf.size()), (p - m_tmp_buf.data()));
		ADD_OUTSTANDING_ASYNC("socks5::on_handshake3");
		boost::asio::async_write(m_socks5_sock
			, boost::asio::buffer(m_tmp_buf.data(), aux::numeric_cast<std::size_t>(p - m_tmp_buf.data()))
			, std::bind(&socks5::handshake3, self(), _1));
	}
	else
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::handshake
				, socks_error::unsupported_authentication_method);

		error_code ec;
		m_socks5_sock.close(ec);
		return;
	}
}